

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.h
# Opt level: O3

void __thiscall FParser::FParser(FParser *this,DFsScript *scr)

{
  char *pcVar1;
  
  (this->t_return).string.Chars = FString::NullString.Nothing;
  (this->t_return).type = 1;
  (this->t_return).value.i = 0;
  (this->t_func).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  this->LineStart = (char *)0x0;
  this->Rover = (char *)0x0;
  pcVar1 = (char *)operator_new__((long)scr->len + 0x20);
  this->Tokens[0] = pcVar1;
  this->NumTokens = 0;
  this->Script = scr;
  this->Section = (DFsSection *)0x0;
  this->PrevSection = (DFsSection *)0x0;
  this->BraceType = 0;
  return;
}

Assistant:

FParser(DFsScript *scr)
	{
		LineStart = NULL;
		Rover = NULL;
		Tokens[0] = new char[scr->len+32];	// 32 for safety. FS seems to need a few bytes more than the script's actual length.
		NumTokens = 0;
		Script = scr;
		Section = PrevSection = NULL;
		BraceType = 0;
	}